

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

Builder * embree::sse2::BVH4InstanceArrayMeshBuilderMortonGeneral
                    (void *bvh,InstanceArray *mesh,GTypeMask gtype,uint geomID,size_t mode)

{
  BVHNMeshBuilderMorton<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive> *this;
  
  this = (BVHNMeshBuilderMorton<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive> *)
         ::operator_new(0x78);
  BVHNMeshBuilderMorton<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::
  BVHNMeshBuilderMorton(this,(BVH *)bvh,mesh,(uint)gtype,(ulong)geomID,1,7);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4InstanceArrayMeshBuilderMortonGeneral (void* bvh, InstanceArray* mesh, Geometry::GTypeMask gtype, unsigned int geomID, size_t mode) { return new class BVHNMeshBuilderMorton<4,InstanceArray,InstanceArrayPrimitive>((BVH4*)bvh,mesh,gtype,geomID,1,BVH4::maxLeafBlocks); }